

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall ftxui::Node::Check(Node *this,Status *status)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<ftxui::Node> *child;
  pointer psVar3;
  
  psVar1 = (this->children_).
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->children_).
                super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_Node[5])(peVar2,status);
  }
  status->need_iteration = (bool)(status->need_iteration | status->iteration == 0);
  return;
}

Assistant:

void Node::Check(Status* status) {
  for (auto& child : children_) {
    child->Check(status);
  }
  status->need_iteration |= (status->iteration == 0);
}